

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wood.cpp
# Opt level: O2

void __thiscall Wood::apply(Wood *this,Vector *p,SurfaceData *t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar1 = p->x * (this->super_Texture).scale.x + (this->super_Texture).offs.x;
  dVar4 = p->y * (this->super_Texture).scale.y + (this->super_Texture).offs.y;
  dVar3 = (this->super_Texture).turb;
  dVar5 = this->ring_spacing;
  dVar2 = turbulence(p,(this->super_Texture).octaves);
  dVar3 = sin(dVar2 * dVar3 + SQRT(dVar1 * dVar1 + dVar4 * dVar4) * dVar5);
  dVar3 = pow((dVar3 + 1.0) * 0.5,(double)this->squeeze);
  dVar5 = 1.0 - dVar3;
  (t->color).x = dVar3 * 0.05 + dVar5 * 0.6;
  (t->color).y = dVar3 * 0.01 + dVar5 * 0.24;
  (t->color).z = dVar3 * 0.005 + dVar5 * 0.1;
  t->ks = (dVar3 * 0.3 + 0.7) * t->ks;
  return;
}

Assistant:

void Wood::apply( Vector& p, Grayzer::SurfaceData& t )
{
   double x = p.x * scale.x + offs.x;
   double y = p.y * scale.y + offs.y;
   double s = pow(   sineWave( ring_spacing * sqrt(  x *   x +   y *   y )   +
            turb  * turbulence(p,   octaves) ), squeeze  );

   t.color  = LightWood * (1 - s) + DarkWood * s;
   t.ks *=  0.3   * s   + 0.7;
}